

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O3

void solver_cancel_until(solver_t *s,uint level)

{
  heap_t *h;
  vec_uint_t *pvVar1;
  int *piVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  vec_int_t *pvVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  pvVar1 = s->trail_lim;
  if (pvVar1->size <= level) {
    return;
  }
  uVar5 = s->trail->size;
  do {
    puVar3 = pvVar1->data;
    uVar7 = puVar3[level];
    if (uVar5 <= uVar7) {
      s->i_qhead = uVar7;
      uVar5 = puVar3[level];
      if ((uVar5 <= s->trail->cap) && (s->trail->size = uVar5, level <= pvVar1->cap)) {
        pvVar1->size = level;
        return;
      }
      __assert_fail("p->cap >= new_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                    ,0x65,"void vec_uint_shrink(vec_uint_t *, unsigned int)");
    }
    uVar5 = uVar5 - 1;
    if (s->trail->size <= uVar5) break;
    uVar7 = s->trail->data[uVar5] >> 1;
    if (s->assigns->size <= uVar7) {
      __assert_fail("(idx >= 0) && (idx < vec_char_size(p))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_char.h"
                    ,0xb9,"void vec_char_assign(vec_char_t *, unsigned int, char)");
    }
    s->assigns->data[uVar7] = '\x03';
    if (s->reasons->size <= uVar7) {
      __assert_fail("(idx >= 0) && (idx < vec_uint_size(p))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                    ,0xc2,"void vec_uint_assign(vec_uint_t *, unsigned int, unsigned int)");
    }
    s->reasons->data[uVar7] = 0xffffffff;
    h = s->var_order;
    pvVar6 = h->indices;
    uVar9 = pvVar6->size;
    uVar4 = (ulong)uVar9;
    if (uVar7 < uVar9) {
      if (pvVar6->data[uVar7] < 0) goto LAB_0090762c;
    }
    else {
      uVar8 = uVar7 + 1;
      pvVar6->size = uVar8;
      if (pvVar6->cap <= uVar7) {
        piVar2 = (int *)realloc(pvVar6->data,(ulong)uVar8 << 2);
        pvVar6->data = piVar2;
        if (piVar2 == (int *)0x0) {
          __assert_fail("p->data != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_int.h"
                        ,0x5e,"void vec_int_resize(vec_int_t *, unsigned int)");
        }
        pvVar6->cap = uVar8;
        pvVar6 = h->indices;
        uVar8 = pvVar6->size;
      }
      bVar10 = uVar9 < uVar8;
      uVar9 = uVar8;
      if (bVar10) {
        piVar2 = pvVar6->data;
        do {
          piVar2[uVar4] = -1;
          uVar4 = uVar4 + 1;
          uVar9 = pvVar6->size;
        } while (uVar4 < uVar9);
      }
LAB_0090762c:
      if (uVar9 <= uVar7) {
        __assert_fail("(i >= 0) && (i < vec_int_size(p))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_int.h"
                      ,0xa6,"void vec_int_assign(vec_int_t *, unsigned int, int)");
      }
      if (-1 < pvVar6->data[uVar7]) {
        __assert_fail("!heap_in_heap(p, entry)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/heap.h"
                      ,0x7f,"void heap_insert(heap_t *, unsigned int)");
      }
      pvVar1 = h->data;
      uVar9 = pvVar1->size;
      uVar4 = (ulong)uVar9;
      pvVar6->data[uVar7] = uVar9;
      if (uVar9 == pvVar1->cap) {
        if (uVar9 < 0x10) {
          puVar3 = (uint *)realloc(pvVar1->data,0x40);
          pvVar1->data = puVar3;
          uVar9 = 0x10;
          if (puVar3 == (uint *)0x0) {
LAB_009077e2:
            __assert_fail("p->data != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                          ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
          }
        }
        else {
          if ((int)uVar9 < 1) goto LAB_009076ae;
          puVar3 = (uint *)realloc(pvVar1->data,uVar4 * 8);
          pvVar1->data = puVar3;
          if (puVar3 == (uint *)0x0) goto LAB_009077e2;
          uVar9 = uVar9 * 2;
        }
        pvVar1->cap = uVar9;
        uVar4 = (ulong)pvVar1->size;
        pvVar6 = h->indices;
      }
LAB_009076ae:
      pvVar1->data[uVar4] = uVar7;
      pvVar1->size = pvVar1->size + 1;
      if (pvVar6->size <= uVar7) {
        __assert_fail("i >= 0 && i < p->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_int.h"
                      ,0x7e,"int vec_int_at(vec_int_t *, unsigned int)");
      }
      heap_percolate_up(h,pvVar6->data[uVar7]);
    }
    pvVar1 = s->trail_lim;
  } while (level < pvVar1->size);
  __assert_fail("idx >= 0 && idx < p->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                ,0x85,"unsigned int vec_uint_at(vec_uint_t *, unsigned int)");
}

Assistant:

void solver_cancel_until(solver_t *s, unsigned level)
{
    unsigned i;

    if (solver_dlevel(s) <= level)
        return;
    for (i = vec_uint_size(s->trail); i --> vec_uint_at(s->trail_lim, level);) {
        unsigned var = lit2var(vec_uint_at(s->trail, i));

        vec_char_assign(s->assigns, var, SATOKO_VAR_UNASSING);
        vec_uint_assign(s->reasons, var, UNDEF);
        if (!heap_in_heap(s->var_order, var))
            heap_insert(s->var_order, var);
    }
    s->i_qhead = vec_uint_at(s->trail_lim, level);
    vec_uint_shrink(s->trail, vec_uint_at(s->trail_lim, level));
    vec_uint_shrink(s->trail_lim, level);
}